

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_convert(uchar *out,uchar *in,LodePNGColorMode *mode_out,LodePNGColorMode *mode_in,
                    uint w,uint h)

{
  int iVar1;
  size_t sVar2;
  uchar local_f4;
  uchar local_f3;
  uchar local_f2;
  uchar local_f1;
  unsigned_short local_f0;
  unsigned_short local_ee;
  uchar a_1;
  uchar b_1;
  uchar g_1;
  uchar r_1;
  unsigned_short a;
  unsigned_short b;
  unsigned_short g;
  unsigned_short r;
  uchar *p;
  size_t palsize;
  size_t numbytes;
  size_t numpixels;
  ColorTree tree;
  size_t i;
  uint h_local;
  uint w_local;
  LodePNGColorMode *mode_in_local;
  LodePNGColorMode *mode_out_local;
  uchar *in_local;
  uchar *out_local;
  
  numbytes = (size_t)(w * h);
  iVar1 = lodepng_color_mode_equal(mode_out,mode_in);
  if (iVar1 == 0) {
    if (mode_out->colortype == LCT_PALETTE) {
      p = (uchar *)(ulong)(uint)(1 << ((byte)mode_out->bitdepth & 0x1f));
      if ((uchar *)mode_out->palettesize < p) {
        p = (uchar *)mode_out->palettesize;
      }
      color_tree_init((ColorTree *)&numpixels);
      tree.index = 0;
      tree._132_4_ = 0;
      for (; (uchar *)tree._128_8_ != p; tree._128_8_ = tree._128_8_ + 1) {
        _a = mode_out->palette + tree._128_8_ * 4;
        color_tree_add((ColorTree *)&numpixels,*_a,_a[1],_a[2],_a[3],tree.index);
      }
    }
    if ((mode_in->bitdepth == 0x10) && (mode_out->bitdepth == 0x10)) {
      tree.index = 0;
      tree._132_4_ = 0;
      for (; tree._128_8_ != numbytes; tree._128_8_ = tree._128_8_ + 1) {
        _g_1 = 0;
        _a_1 = 0;
        local_ee = 0;
        local_f0 = 0;
        getPixelColorRGBA16((unsigned_short *)&g_1,(unsigned_short *)&a_1,&local_ee,&local_f0,in,
                            tree._128_8_,mode_in);
        rgba16ToPixel(out,tree._128_8_,mode_out,_g_1,_a_1,local_ee,local_f0);
      }
    }
    else if ((mode_out->bitdepth == 8) && (mode_out->colortype == LCT_RGBA)) {
      getPixelColorsRGBA8(out,numbytes,1,in,mode_in);
    }
    else if ((mode_out->bitdepth == 8) && (mode_out->colortype == LCT_RGB)) {
      getPixelColorsRGBA8(out,numbytes,0,in,mode_in);
    }
    else {
      local_f1 = '\0';
      local_f2 = '\0';
      local_f3 = '\0';
      local_f4 = '\0';
      tree.index = 0;
      tree._132_4_ = 0;
      for (; tree._128_8_ != numbytes; tree._128_8_ = tree._128_8_ + 1) {
        getPixelColorRGBA8(&local_f1,&local_f2,&local_f3,&local_f4,in,tree._128_8_,mode_in);
        rgba8ToPixel(out,tree._128_8_,mode_out,(ColorTree *)&numpixels,local_f1,local_f2,local_f3,
                     local_f4);
      }
    }
    if (mode_out->colortype == LCT_PALETTE) {
      color_tree_cleanup((ColorTree *)&numpixels);
    }
  }
  else {
    sVar2 = lodepng_get_raw_size(w,h,mode_in);
    tree.index = 0;
    tree._132_4_ = 0;
    for (; tree._128_8_ != sVar2; tree._128_8_ = tree._128_8_ + 1) {
      out[tree._128_8_] = in[tree._128_8_];
    }
  }
  return 0;
}

Assistant:

unsigned lodepng_convert(unsigned char* out, const unsigned char* in,
                         LodePNGColorMode* mode_out, const LodePNGColorMode* mode_in,
                         unsigned w, unsigned h)
{
  size_t i;
  ColorTree tree;
  size_t numpixels = w * h;

  if(lodepng_color_mode_equal(mode_out, mode_in))
  {
    size_t numbytes = lodepng_get_raw_size(w, h, mode_in);
    for(i = 0; i != numbytes; ++i) out[i] = in[i];
    return 0;
  }

  if(mode_out->colortype == LCT_PALETTE)
  {
    size_t palsize = 1u << mode_out->bitdepth;
    if(mode_out->palettesize < palsize) palsize = mode_out->palettesize;
    color_tree_init(&tree);
    for(i = 0; i != palsize; ++i)
    {
      unsigned char* p = &mode_out->palette[i * 4];
      color_tree_add(&tree, p[0], p[1], p[2], p[3], i);
    }
  }

  if(mode_in->bitdepth == 16 && mode_out->bitdepth == 16)
  {
    for(i = 0; i != numpixels; ++i)
    {
      unsigned short r = 0, g = 0, b = 0, a = 0;
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);
      rgba16ToPixel(out, i, mode_out, r, g, b, a);
    }
  }
  else if(mode_out->bitdepth == 8 && mode_out->colortype == LCT_RGBA)
  {
    getPixelColorsRGBA8(out, numpixels, 1, in, mode_in);
  }
  else if(mode_out->bitdepth == 8 && mode_out->colortype == LCT_RGB)
  {
    getPixelColorsRGBA8(out, numpixels, 0, in, mode_in);
  }
  else
  {
    unsigned char r = 0, g = 0, b = 0, a = 0;
    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode_in);
      rgba8ToPixel(out, i, mode_out, &tree, r, g, b, a);
    }
  }

  if(mode_out->colortype == LCT_PALETTE)
  {
    color_tree_cleanup(&tree);
  }

  return 0; /*no error (this function currently never has one, but maybe OOM detection added later.)*/
}